

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_image.cxx
# Opt level: O0

int __thiscall
Fl_PostScript_Graphics_Driver::draw_scaled
          (Fl_PostScript_Graphics_Driver *this,Fl_Image *img,int XP,int YP,int WP,int HP)

{
  int iVar1;
  int iVar2;
  Fl_Image *pFVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  int *piVar10;
  uint local_48;
  uint local_44;
  int H;
  int W;
  int Y;
  int X;
  int HP_local;
  int WP_local;
  int YP_local;
  int XP_local;
  Fl_Image *img_local;
  Fl_PostScript_Graphics_Driver *this_local;
  
  piVar10 = &H;
  Y = HP;
  X = WP;
  HP_local = YP;
  WP_local = XP;
  _YP_local = img;
  img_local = (Fl_Image *)this;
  (*(this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device[0x2b])
            (this,(ulong)(uint)XP,(ulong)(uint)YP,(ulong)(uint)WP,(ulong)(uint)HP,&W,piVar10,
             &local_44,&local_48);
  if ((local_44 != 0) && (local_48 != 0)) {
    (*(this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device[0x2d])();
    clocale_printf(this,"%d %d %i %i CL\n",(ulong)(uint)W,(ulong)(uint)H,(ulong)local_44,
                   (ulong)local_48);
    iVar2 = WP_local;
    iVar1 = HP_local;
    fVar8 = (float)X;
    iVar4 = Fl_Image::w(_YP_local);
    fVar9 = (float)Y;
    iVar5 = Fl_Image::h(_YP_local);
    clocale_printf(this,"GS %d %d TR  %f %f SC GS\n",(double)(fVar8 / (float)iVar4),
                   (double)(fVar9 / (float)iVar5),(ulong)(uint)iVar2,(ulong)(uint)iVar1);
    pFVar3 = _YP_local;
    uVar6 = Fl_Image::w(_YP_local);
    uVar7 = Fl_Image::h(_YP_local);
    (*pFVar3->_vptr_Fl_Image[7])
              (pFVar3,0,0,(ulong)uVar6,(ulong)uVar7,0,(ulong)piVar10 & 0xffffffff00000000);
    clocale_printf(this,"GR GR\n");
    (*(this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device[0x2e])();
  }
  return 1;
}

Assistant:

int Fl_PostScript_Graphics_Driver::draw_scaled(Fl_Image *img, int XP, int YP, int WP, int HP){
  int X, Y, W, H;
  clip_box(XP,YP,WP,HP,X,Y,W,H); // X,Y,W,H will give the unclipped area of XP,YP,WP,HP
  if (W == 0 || H == 0) return 1;
  push_no_clip(); // remove the FLTK clip that can't be rescaled
  clocale_printf("%d %d %i %i CL\n", X, Y, W, H);
  clocale_printf("GS %d %d TR  %f %f SC GS\n", XP, YP, float(WP)/img->w(), float(HP)/img->h());
  img->draw(0, 0, img->w(), img->h(), 0, 0);
  clocale_printf("GR GR\n");
  pop_clip(); // restore FLTK's clip
  return 1;
}